

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::append
          (ZoneStack<asmjit::v1_14::RABlock_*> *this,RABlock *item)

{
  Error EVar1;
  long lVar2;
  undefined8 *puVar3;
  
  if (*(long *)this == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xb2,"isInitialized()");
  }
  lVar2 = *(long *)&this->field_0x10;
  puVar3 = *(undefined8 **)(lVar2 + 0x18);
  if ((undefined8 *)(lVar2 + 0x1f8U) < puVar3) {
    EVar1 = ZoneStackBase::_prepareBlock(&this->super_ZoneStackBase,1,0x20);
    if (EVar1 != 0) {
      return EVar1;
    }
    lVar2 = *(long *)&this->field_0x10;
    puVar3 = *(undefined8 **)(lVar2 + 0x18);
  }
  if (((undefined8 *)(lVar2 + 0x20U) <= puVar3) && (puVar3 <= (undefined8 *)(lVar2 + 0x1f8U))) {
    *puVar3 = item;
    *(undefined8 **)(lVar2 + 0x18) = puVar3 + 1;
    return 0;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
             ,0xbb,"ptr >= block->data<T>() && ptr <= block->data<T>() + (kNumBlockItems - 1)");
}

Assistant:

inline Error append(T item) noexcept {
    ASMJIT_ASSERT(isInitialized());
    Block* block = _block[kBlockIndexLast];

    if (!block->canAppend<T>()) {
      ASMJIT_PROPAGATE(_prepareBlock(kBlockIndexLast, kStartBlockIndex));
      block = _block[kBlockIndexLast];
    }

    T* ptr = block->end<T>();
    ASMJIT_ASSERT(ptr >= block->data<T>() && ptr <= block->data<T>() + (kNumBlockItems - 1));

    *ptr++ = item;
    block->setEnd(ptr);
    return kErrorOk;
  }